

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O3

Var Js::JavascriptNumber::ToVarIntCheck(double value,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  uint64 uVar3;
  uint64 uVar4;
  undefined4 *puVar5;
  undefined1 *puVar6;
  
  puVar6 = &DAT_1000000000000;
  if ((value != 0.0) || (NAN(value))) {
    if ((value != 1.0) || (NAN(value))) {
      if (((double)(int)value != value) || (NAN((double)(int)value) || NAN(value))) {
        uVar3 = NumberUtilities::ToSpecial(value);
        bVar2 = NumberUtilities::IsNan(value);
        if (bVar2) {
          uVar4 = NumberUtilities::ToSpecial(value);
          if (uVar4 != 0xfff8000000000000) {
            uVar4 = NumberUtilities::ToSpecial(value);
            if (uVar4 != 0x7ff8000000000000) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
              *puVar5 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                          ,0xa2,
                                          "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                          ,"We should only produce a NaN with this value");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              *puVar5 = 0;
            }
          }
        }
        puVar6 = (undefined1 *)(uVar3 ^ 0xfffc000000000000);
      }
      else {
        puVar6 = (undefined1 *)((ulong)(uint)(int)value | 0x1000000000000);
      }
    }
    else {
      puVar6 = &DAT_1000000000001;
    }
  }
  else {
    bVar2 = NumberUtilities::IsSpecial(value,0x8000000000000000);
    if (bVar2) {
      puVar6 = (undefined1 *)
               (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).negativeZero.ptr;
    }
  }
  return puVar6;
}

Assistant:

Var JavascriptNumber::ToVarIntCheck(double value,ScriptContext* scriptContext)
    {
        //
        // Check if a well-known value:
        // - This significantly cuts down on the below floating-point to integer conversions.
        //

        if (value == 0.0)
        {
            if(IsNegZero(value))
            {
                return scriptContext->GetLibrary()->GetNegativeZero();
            }
            return TaggedInt::ToVarUnchecked(0);
        }
        if (value == 1.0)
        {
            return TaggedInt::ToVarUnchecked(1);
        }

        //
        // Check if number can be reduced back into a TaggedInt:
        // - This avoids extra GC.
        //

        int nValue      = (int) value;
        double dblCheck = (double) nValue;
        if ((dblCheck == value) && (!TaggedInt::IsOverflow(nValue)))
        {
            return TaggedInt::ToVarUnchecked(nValue);
        }

        return JavascriptNumber::NewInlined(value,scriptContext);
    }